

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WirehairCodec.cpp
# Opt level: O3

void __thiscall wirehair::Codec::SetMixingColumnsForDeferredRows(Codec *this)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  ushort uVar5;
  ushort uVar6;
  PeelRow *pPVar7;
  uint64_t *puVar8;
  uint uVar9;
  uint uVar10;
  uint i;
  long lVar11;
  uint uVar12;
  ushort auStack_36 [3];
  
  for (uVar1 = this->_defer_head_rows; uVar1 != 0xffff; uVar1 = pPVar7[uVar1].NextRow) {
    pPVar7 = this->_peel_rows;
    lVar11 = 1;
    pPVar7[uVar1].Marks.Unmarked[0] = 0xffff;
    uVar10 = (uint)uVar1 * this->_ge_pitch;
    uVar2 = pPVar7[uVar1].Params.MixFirst;
    uVar9 = (uint)uVar2;
    uVar3 = pPVar7[uVar1].Params.MixAdd;
    puVar8 = this->_compress_matrix;
    uVar4 = this->_defer_count;
    uVar5 = this->_mix_count;
    uVar6 = this->_mix_next_prime;
    do {
      uVar9 = ((uVar9 & 0xffff) + (uint)uVar3) % (uint)uVar6;
      if (uVar5 <= uVar9) {
        uVar9 = uVar6 - uVar9;
        uVar12 = uVar9 & 0xffff;
        if (uVar3 < (ushort)uVar9) {
          uVar9 = ((uint)uVar3 * 0x10000 - uVar12) % (uint)uVar3;
        }
        else {
          uVar9 = uVar3 - uVar12;
        }
      }
      auStack_36[lVar11] = (ushort)uVar9;
      lVar11 = lVar11 + 1;
    } while (lVar11 != 3);
    uVar9 = (uint)uVar2 + (uint)uVar4;
    puVar8[(ulong)uVar10 + (ulong)(uVar9 >> 6)] =
         puVar8[(ulong)uVar10 + (ulong)(uVar9 >> 6)] ^ 1L << ((ulong)uVar9 & 0x3f);
    uVar9 = (uint)auStack_36[1] + (uint)uVar4;
    puVar8[(ulong)uVar10 + (ulong)(uVar9 >> 6)] =
         puVar8[(ulong)uVar10 + (ulong)(uVar9 >> 6)] ^ 1L << ((ulong)uVar9 & 0x3f);
    puVar8[(ulong)uVar10 + (ulong)((uint)auStack_36[2] + (uint)uVar4 >> 6)] =
         puVar8[(ulong)uVar10 + (ulong)((uint)auStack_36[2] + (uint)uVar4 >> 6)] ^
         1L << ((ulong)((uint)auStack_36[2] + (uint)uVar4) & 0x3f);
  }
  return;
}

Assistant:

void Codec::SetMixingColumnsForDeferredRows()
{
    CAT_IF_DUMP(cout << endl << "---- SetMixingColumnsForDeferredRows ----" << endl << endl;)

    PeelRow * GF256_RESTRICT row;

    // For each deferred row:
    for (uint16_t defer_row_i = _defer_head_rows;
        defer_row_i != LIST_TERM;
        defer_row_i = row->NextRow)
    {
        row = &_peel_rows[defer_row_i];

        CAT_IF_DUMP(cout << "Deferred row " << defer_row_i << " set mix columns :";)

        // Mark it as deferred for the following loop
        row->Marks.Result.PeelColumn = LIST_TERM;

        // Set up mixing column generator
        uint64_t *ge_row = _compress_matrix + _ge_pitch * defer_row_i;

        const unsigned defer_count = _defer_count;
        const RowMixIterator mix(row->Params, _mix_count, _mix_next_prime);

        // Generate mixing column 1
        const unsigned ge_column_i = defer_count + mix.Columns[0];
        ge_row[ge_column_i >> 6] ^= (uint64_t)1 << (ge_column_i & 63);
        CAT_IF_DUMP(cout << " " << ge_column_i;)

        // Generate mixing column 2
        const unsigned ge_column_j = defer_count + mix.Columns[1];
        ge_row[ge_column_j >> 6] ^= (uint64_t)1 << (ge_column_j & 63);
        CAT_IF_DUMP(cout << " " << ge_column_j;)

        // Generate mixing column 3
        const unsigned ge_column_k = defer_count + mix.Columns[2];
        ge_row[ge_column_k >> 6] ^= (uint64_t)1 << (ge_column_k & 63);
        CAT_IF_DUMP(cout << " " << ge_column_k;)

        CAT_IF_DUMP(cout << endl;)
    }
}